

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdir-posix.c
# Opt level: O2

pboolean p_dir_rewind(PDir *dir,PError **error)

{
  pboolean pVar1;
  
  if ((dir == (PDir *)0x0) || ((DIR *)dir->dir == (DIR *)0x0)) {
    pVar1 = 0;
    p_error_set_error_p(error,0x1fb,0,"Invalid input argument");
  }
  else {
    rewinddir((DIR *)dir->dir);
    pVar1 = 1;
  }
  return pVar1;
}

Assistant:

P_LIB_API pboolean
p_dir_rewind (PDir	*dir,
	      PError	**error)
{
	if (P_UNLIKELY (dir == NULL || dir->dir == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Invalid input argument");
		return FALSE;
	}

	rewinddir (dir->dir);

	return TRUE;
}